

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BindingRenderCase::init
          (BindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderTarget *pRVar2;
  NotSupportedError *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestError *this_01;
  allocator<char> local_111;
  string local_110;
  undefined1 local_ed;
  int local_ec;
  string local_e8;
  int local_b4;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  BindingRenderCase *local_10;
  BindingRenderCase *this_local;
  
  local_10 = this;
  pRVar2 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getWidth(pRVar2);
  if (0x3f < iVar1) {
    pRVar2 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = tcu::RenderTarget::getHeight(pRVar2);
    if (0x3f < iVar1) {
      pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar1 = (*pRVar3->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x708))(1,&this->m_vao);
      pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar1 = (*pRVar3->_vptr_RenderContext[3])();
      iVar1 = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
      if (iVar1 != 0) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"could not gen vao",&local_111);
        tcu::TestError::TestError(this_01,&local_110);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
      iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])();
      return iVar1;
    }
  }
  local_ed = 1;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_b4 = 0x40;
  de::toString<int>(&local_b0,&local_b4);
  std::operator+(&local_90,"Test requires at least ",&local_b0);
  std::operator+(&local_70,&local_90,"x");
  local_ec = 0x40;
  de::toString<int>(&local_e8,&local_ec);
  std::operator+(&local_50,&local_70,&local_e8);
  std::operator+(&local_30,&local_50," render target");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
  local_ed = 0;
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void BindingRenderCase::init (void)
{
	// check requirements
	if (m_context.getRenderTarget().getWidth() < TEST_RENDER_SIZE || m_context.getRenderTarget().getHeight() < TEST_RENDER_SIZE)
		throw tcu::NotSupportedError("Test requires at least " + de::toString<int>(TEST_RENDER_SIZE) + "x" + de::toString<int>(TEST_RENDER_SIZE) + " render target");

	// resources
	m_context.getRenderContext().getFunctions().genVertexArrays(1, &m_vao);
	if (m_context.getRenderContext().getFunctions().getError() != GL_NO_ERROR)
		throw tcu::TestError("could not gen vao");

	createBuffers();
	createShader();
}